

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

Catalog * duckdb::Catalog::GetCatalog(CatalogEntryRetriever *retriever,string *catalog_name)

{
  pointer pcVar1;
  BinderException *this;
  optional_ptr<duckdb::Catalog,_true> catalog;
  optional_ptr<duckdb::Catalog,_true> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_70 = GetCatalogEntry(retriever,catalog_name);
  if (local_70.ptr != (Catalog *)0x0) {
    optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_70);
    return local_70.ptr;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Catalog \"%s\" does not exist!","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (catalog_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + catalog_name->_M_string_length);
  BinderException::BinderException<std::__cxx11::string>(this,&local_48,&local_68);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Catalog &Catalog::GetCatalog(CatalogEntryRetriever &retriever, const string &catalog_name) {
	auto catalog = Catalog::GetCatalogEntry(retriever, catalog_name);
	if (!catalog) {
		throw BinderException("Catalog \"%s\" does not exist!", catalog_name);
	}
	return *catalog;
}